

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

_Bool make_attack_normal(monster *mon,player *p)

{
  random_value *prVar1;
  loc grid2;
  blow_effect *effect_00;
  blow_method_conflict *pbVar2;
  bool bVar3;
  random_value v;
  random_value dice_00;
  random_value dice_01;
  _Bool _Var4;
  int iVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  monster_lore_conflict *lore_00;
  source origin;
  source sVar8;
  wchar_t local_18c;
  char local_175 [5];
  wchar_t wStack_170;
  char dice_1 [5];
  wchar_t tmp_1;
  wchar_t amt_1;
  wchar_t tmp;
  wchar_t amt;
  melee_effect_handler_context_t context;
  melee_effect_handler_f effect_handler;
  random_value dice;
  blow_method *method;
  blow_effect *effect;
  _Bool do_stun;
  _Bool do_cut;
  wchar_t damage;
  _Bool obvious;
  _Bool visible;
  loc_conflict pgrid;
  _Bool blinked;
  char ddesc [80];
  char m_name [80];
  int local_30;
  wchar_t ap_cnt;
  wchar_t rlev;
  monster_lore *lore;
  player *p_local;
  monster *mon_local;
  
  lore_00 = get_lore(mon->race);
  if (mon->race->level < L'\x01') {
    local_18c = L'\x01';
  }
  else {
    local_18c = mon->race->level;
  }
  pgrid.x._3_1_ = 0;
  _Var4 = flag_has_dbg(mon->race->flags,0xb,0x14,"mon->race->flags","RF_NEVER_BLOW");
  if (_Var4) {
    mon_local._7_1_ = false;
  }
  else {
    monster_desc(ddesc + 0x48,0x50,mon,L'̔');
    monster_desc((char *)&pgrid.y,0x50,mon,L'\x88');
    for (local_30 = 0; local_30 < (int)(uint)z_info->mon_blows_max; local_30 = local_30 + 1) {
      grid2 = p->grid;
      _Var4 = monster_is_visible(mon);
      bVar3 = true;
      if (!_Var4) {
        bVar3 = L'\0' < mon->race->light;
      }
      do_stun = false;
      effect._4_4_ = L'\0';
      effect_00 = (blow_effect *)mon->race->blow[local_30].effect;
      pbVar2 = mon->race->blow[local_30].method;
      prVar1 = &mon->race->blow[local_30].dice;
      dice_01 = *prVar1;
      dice_00 = *prVar1;
      v = *prVar1;
      if (((pbVar2 == (blow_method_conflict *)0x0) || ((p->is_dead & 1U) != 0)) ||
         ((p->upkeep->generate_level & 1U) != 0)) break;
      if (effect_00 == (blow_effect *)0x0) {
        __assert_fail("effect",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-attack.c"
                      ,0x24c,"_Bool make_attack_normal(struct monster *, struct player *)");
      }
      iVar5 = strcmp(effect_00->name,"NONE");
      if (iVar5 == 0) {
LAB_0018853d:
        disturb(p);
        if (p->timed[0xb] < 1) {
LAB_001885dd:
          effect._3_1_ = pbVar2->cut & 1;
          effect._2_1_ = pbVar2->stun & 1;
          do_stun = true;
          effect._4_4_ = randcalc(v,local_18c,RANDOMISE);
          if (mon->m_timed[1] != 0) {
            effect._4_4_ = (effect._4_4_ * 0x4b) / 100;
          }
          context.m_name = (char *)melee_handler_for_blow_effect(effect_00->name);
          if ((melee_effect_handler_f)context.m_name == (melee_effect_handler_f)0x0) {
            msg("ERROR: Effect handler not found for %s.",effect_00->name);
          }
          else {
            context.mon = (monster *)0x0;
            context.t_mon._0_4_ = local_18c;
            context.method._0_4_ = (p->state).ac + (p->state).to_a;
            context._40_8_ = &pgrid.y;
            context.ddesc._0_1_ = 1;
            context.ddesc._1_1_ = pgrid.x._3_1_ & 1;
            context.ddesc._4_4_ = effect._4_4_;
            context._56_8_ = ddesc + 0x48;
            _tmp = p;
            context.p = (player *)mon;
            context._24_8_ = pbVar2;
            (*(code *)context.m_name)((melee_effect_handler_context_t *)&tmp);
            do_stun = (_Bool)((byte)context.ddesc & 1);
            pgrid.x._3_1_ = context.ddesc._1_1_ & 1;
            effect._4_4_ = context.ddesc._4_4_;
          }
          if ((p->is_dead & 1U) != 0) {
            effect._3_1_ = 0;
            effect._2_1_ = 0;
          }
          if ((effect._3_1_ != 0) && (effect._2_1_ != 0)) {
            uVar7 = Rand_div(100);
            if ((int)uVar7 < 0x32) {
              effect._3_1_ = 0;
            }
            else {
              effect._2_1_ = 0;
            }
          }
          if (effect._3_1_ != 0) {
            wVar6 = monster_critical(dice_00,local_18c,effect._4_4_);
            switch(wVar6) {
            case L'\0':
              amt_1 = L'\0';
              break;
            case L'\x01':
              uVar7 = Rand_div(5);
              amt_1 = uVar7 + L'\x01';
              break;
            case L'\x02':
              uVar7 = Rand_div(5);
              amt_1 = uVar7 + L'\x06';
              break;
            case L'\x03':
              uVar7 = Rand_div(0x14);
              amt_1 = uVar7 + L'\x15';
              break;
            case L'\x04':
              uVar7 = Rand_div(0x32);
              amt_1 = uVar7 + L'3';
              break;
            case L'\x05':
              uVar7 = Rand_div(100);
              amt_1 = uVar7 + L'e';
              break;
            case L'\x06':
              amt_1 = L'Ĭ';
              break;
            default:
              amt_1 = L'Ǵ';
            }
            if (amt_1 != L'\0') {
              player_inc_timed(p,L'\b',amt_1,true,true,true);
            }
          }
          if (effect._2_1_ != 0) {
            wStack_170 = monster_critical(dice_01,local_18c,effect._4_4_);
            switch(wStack_170) {
            case L'\0':
              dice_1[1] = '\0';
              dice_1[2] = '\0';
              dice_1[3] = '\0';
              dice_1[4] = '\0';
              break;
            case L'\x01':
              uVar7 = Rand_div(5);
              dice_1._1_4_ = uVar7 + 1;
              break;
            case L'\x02':
              uVar7 = Rand_div(10);
              dice_1._1_4_ = uVar7 + 0xb;
              break;
            case L'\x03':
              uVar7 = Rand_div(0x14);
              dice_1._1_4_ = uVar7 + 0x15;
              break;
            case L'\x04':
              uVar7 = Rand_div(0x1e);
              dice_1._1_4_ = uVar7 + 0x1f;
              break;
            case L'\x05':
              uVar7 = Rand_div(0x28);
              dice_1._1_4_ = uVar7 + 0x29;
              break;
            case L'\x06':
              dice_1[1] = 'd';
              dice_1[2] = '\0';
              dice_1[3] = '\0';
              dice_1[4] = '\0';
              break;
            default:
              dice_1[1] = -0x38;
              dice_1[2] = '\0';
              dice_1[3] = '\0';
              dice_1[4] = '\0';
            }
            if (dice_1._1_4_ != 0) {
              player_inc_timed(p,L'\t',dice_1._1_4_,true,true,true);
            }
          }
          goto LAB_00188a1c;
        }
        _Var4 = monster_is_visible(mon);
        if (_Var4) {
          flag_on_dbg(lore_00->flags,0xb,0x3d,"lore->flags","RF_EVIL");
        }
        _Var4 = monster_is_evil(mon);
        if (((!_Var4) || (p->lev < local_18c)) ||
           (uVar7 = Rand_div(100), (int)(uVar7 + (int)p->lev) < 0x33)) goto LAB_001885dd;
        msg("%s is repelled.",ddesc + 0x48);
      }
      else {
        wVar6 = chance_of_monster_hit(mon,effect_00);
        _Var4 = check_hit(p,wVar6);
        if (_Var4) goto LAB_0018853d;
        _Var4 = monster_is_visible(mon);
        if ((_Var4) && ((pbVar2->miss & 1U) != 0)) {
          disturb(p);
          msg("%s misses you.",ddesc + 0x48);
        }
LAB_00188a1c:
        if ((bVar3) &&
           ((((do_stun != false || (effect._4_4_ != L'\0')) ||
             (10 < lore_00->blows[local_30].times_seen)) &&
            (lore_00->blows[local_30].times_seen < 0xff)))) {
          lore_00->blows[local_30].times_seen = lore_00->blows[local_30].times_seen + 1;
        }
        _Var4 = loc_eq(p->grid,grid2);
        if (!_Var4) break;
      }
    }
    if ((pgrid.x._3_1_ & 1) != 0) {
      if (((p->is_dead & 1U) == 0) && (_Var4 = square_isseen((chunk *)cave,mon->grid), _Var4)) {
        add_monster_message(mon,L'4',true);
      }
      strnfmt(local_175,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
      sVar8 = source_monster(mon->midx);
      origin.which = sVar8.which;
      origin._4_4_ = 0;
      origin.what = sVar8.what;
      effect_simple(L':',origin,local_175,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
    if (((p->is_dead & 1U) != 0) && (lore_00->deaths < 0x7fff)) {
      lore_00->deaths = lore_00->deaths + 1;
    }
    lore_update(mon->race,lore_00);
    mon_local._7_1_ = true;
  }
  return mon_local._7_1_;
}

Assistant:

bool make_attack_normal(struct monster *mon, struct player *p)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char ddesc[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the "died from" information (i.e. "a kobold") */
	monster_desc(ddesc, sizeof(ddesc), mon, MDESC_SHOW | MDESC_IND_VIS);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc pgrid = p->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_cut = false;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Handle "leaving" */
		if (p->is_dead || p->upkeep->generate_level) break;

		/* Monster hits player */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			check_hit(p, chance_of_monster_hit(mon, effect))) {
			melee_effect_handler_f effect_handler;

			/* Always disturbing */
			disturb(p);

			/* Hack -- Apply "protection from evil" */
			if (p->timed[TMD_PROTEVIL] > 0) {
				/* Learn about the evil flag */
				if (monster_is_visible(mon))
					rf_on(lore->flags, RF_EVIL);

				if (monster_is_evil(mon) && p->lev >= rlev &&
				    randint0(100) + p->lev > 50) {
					/* Message */
					msg("%s is repelled.", m_name);

					/* Hack -- Next attack */
					continue;
				}
			}

			do_cut = method->cut;
			do_stun = method->stun;

			/* Hack -- assume all attacks are obvious */
			obvious = true;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					p,
					mon,
					NULL,
					rlev,
					method,
					p->state.ac + p->state.to_a,
					ddesc,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Don't cut or stun if player is dead */
			if (p->is_dead) {
				do_cut = false;
				do_stun = false;
			}

			/* Hack -- only one of cut or stun */
			if (do_cut && do_stun) {
				/* Cancel cut */
				if (randint0(100) < 50)
					do_cut = false;

				/* Cancel stun */
				else
					do_stun = false;
			}

			/* Handle cut */
			if (do_cut) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(5) + 5; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(50) + 50; break;
					case 5: amt = randint1(100) + 100; break;
					case 6: amt = 300; break;
					default: amt = 500; break;
				}

				/* Apply the cut */
				if (amt) {
					(void)player_inc_timed(p, TMD_CUT, amt,
						true, true, true);
				}
			}

			/* Handle stun */
			if (do_stun) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt) {
					(void)player_inc_timed(p, TMD_STUN, amt,
						true, true, true);
				}
			}
		} else {
			/* Visible monster missed player, so notify if appropriate. */
			if (monster_is_visible(mon) &&	method->miss) {
				/* Disturbing */
				disturb(p);
				msg("%s misses you.", m_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the player has moved */
		if (!loc_eq(p->grid, pgrid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (!p->is_dead && square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Always notice cause of death */
	if (p->is_dead && (lore->deaths < SHRT_MAX))
		lore->deaths++;

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}